

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_sad_intrin_ssse3.c
# Opt level: O0

uint aom_masked_sad4xh_ssse3
               (uint8_t *src_ptr,int src_stride,uint8_t *a_ptr,int a_stride,uint8_t *b_ptr,
               int b_stride,uint8_t *m_ptr,int m_stride,int height)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int in_ECX;
  undefined4 *in_RDX;
  int iVar12;
  longlong in_RSI;
  undefined4 *in_RDI;
  undefined4 *in_R8;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar13 [16];
  __m128i alVar14;
  undefined4 *in_stack_00000008;
  __m128i pred;
  __m128i pred_16bit;
  __m128i mask;
  __m128i data;
  __m128i m_inv;
  __m128i m;
  __m128i b;
  __m128i a;
  __m128i src;
  __m128i mask_max;
  __m128i res;
  int y;
  undefined4 local_318;
  undefined4 local_308;
  undefined8 local_300;
  undefined8 local_2f0;
  undefined8 local_2e0;
  undefined1 local_2a8;
  undefined1 uStack_2a7;
  undefined1 uStack_2a6;
  undefined1 uStack_2a5;
  undefined1 uStack_2a4;
  undefined1 uStack_2a3;
  undefined1 uStack_2a2;
  undefined1 uStack_2a1;
  undefined1 local_268;
  undefined1 uStack_267;
  undefined1 uStack_266;
  undefined1 uStack_265;
  undefined1 uStack_264;
  undefined1 uStack_263;
  undefined1 uStack_262;
  undefined1 uStack_261;
  undefined1 local_258;
  undefined1 uStack_257;
  undefined1 uStack_256;
  undefined1 uStack_255;
  undefined1 uStack_254;
  undefined1 uStack_253;
  undefined1 uStack_252;
  undefined1 uStack_251;
  undefined2 local_218;
  undefined2 uStack_216;
  undefined2 uStack_214;
  undefined2 uStack_212;
  undefined2 uStack_210;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  undefined4 local_208;
  
  iVar12 = (int)in_RSI;
  local_318 = 0;
  local_300 = in_R8;
  local_2f0 = in_RDX;
  local_2e0 = in_RDI;
  for (local_308 = 0; local_308 < (int)pred[1]; local_308 = local_308 + 2) {
    uVar1 = *local_2e0;
    uVar2 = *(undefined4 *)((long)local_2e0 + (long)iVar12);
    uVar3 = *local_2f0;
    uVar4 = *(undefined4 *)((long)local_2f0 + (long)in_ECX);
    uVar5 = *local_300;
    uVar6 = *(undefined4 *)((long)local_300 + (long)in_R9D);
    uVar7 = *in_stack_00000008;
    uVar8 = *(undefined4 *)((long)in_stack_00000008 + (long)(int)pred[0]);
    local_2a8 = (char)uVar7;
    uStack_2a7 = (char)((uint)uVar7 >> 8);
    uStack_2a6 = (char)((uint)uVar7 >> 0x10);
    uStack_2a5 = (char)((uint)uVar7 >> 0x18);
    uStack_2a4 = (char)uVar8;
    uStack_2a3 = (char)((uint)uVar8 >> 8);
    uStack_2a2 = (char)((uint)uVar8 >> 0x10);
    uStack_2a1 = (char)((uint)uVar8 >> 0x18);
    local_258 = (undefined1)uVar3;
    uStack_257 = (undefined1)((uint)uVar3 >> 8);
    uStack_256 = (undefined1)((uint)uVar3 >> 0x10);
    uStack_255 = (undefined1)((uint)uVar3 >> 0x18);
    uStack_254 = (undefined1)uVar4;
    uStack_253 = (undefined1)((uint)uVar4 >> 8);
    uStack_252 = (undefined1)((uint)uVar4 >> 0x10);
    uStack_251 = (undefined1)((uint)uVar4 >> 0x18);
    local_268 = (undefined1)uVar5;
    uStack_267 = (undefined1)((uint)uVar5 >> 8);
    uStack_266 = (undefined1)((uint)uVar5 >> 0x10);
    uStack_265 = (undefined1)((uint)uVar5 >> 0x18);
    uStack_264 = (undefined1)uVar6;
    uStack_263 = (undefined1)((uint)uVar6 >> 8);
    uStack_262 = (undefined1)((uint)uVar6 >> 0x10);
    uStack_261 = (undefined1)((uint)uVar6 >> 0x18);
    auVar9[1] = local_268;
    auVar9[0] = local_258;
    auVar9[2] = uStack_257;
    auVar9[3] = uStack_267;
    auVar9[4] = uStack_256;
    auVar9[5] = uStack_266;
    auVar9[6] = uStack_255;
    auVar9[7] = uStack_265;
    auVar9[9] = uStack_264;
    auVar9[8] = uStack_254;
    auVar9[10] = uStack_253;
    auVar9[0xb] = uStack_263;
    auVar9[0xc] = uStack_252;
    auVar9[0xd] = uStack_262;
    auVar9[0xe] = uStack_251;
    auVar9[0xf] = uStack_261;
    auVar13[1] = '@' - local_2a8;
    auVar13[0] = local_2a8;
    auVar13[2] = uStack_2a7;
    auVar13[3] = '@' - uStack_2a7;
    auVar13[4] = uStack_2a6;
    auVar13[5] = '@' - uStack_2a6;
    auVar13[6] = uStack_2a5;
    auVar13[7] = '@' - uStack_2a5;
    auVar13[9] = '@' - uStack_2a4;
    auVar13[8] = uStack_2a4;
    auVar13[10] = uStack_2a3;
    auVar13[0xb] = '@' - uStack_2a3;
    auVar13[0xc] = uStack_2a2;
    auVar13[0xd] = '@' - uStack_2a2;
    auVar13[0xe] = uStack_2a1;
    auVar13[0xf] = '@' - uStack_2a1;
    pmaddubsw(auVar9,auVar13);
    alVar14[1] = in_RSI;
    alVar14[0] = 6;
    alVar14 = xx_roundn_epu16(alVar14,(int)in_RDX);
    in_RDX = alVar14[1];
    local_218 = (short)extraout_XMM0_Qa;
    uStack_216 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
    uStack_214 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
    uStack_212 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
    uStack_210 = (short)extraout_XMM0_Qb;
    uStack_20e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
    uStack_20c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
    uStack_20a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
    auVar11[1] = (0 < uStack_216) * (uStack_216 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x10) -
                 (0xff < uStack_216);
    auVar11[0] = (0 < local_218) * (local_218 < 0x100) * (char)extraout_XMM0_Qa - (0xff < local_218)
    ;
    auVar11[2] = (0 < uStack_214) * (uStack_214 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x20) -
                 (0xff < uStack_214);
    auVar11[3] = (0 < uStack_212) * (uStack_212 < 0x100) * (char)((ulong)extraout_XMM0_Qa >> 0x30) -
                 (0xff < uStack_212);
    auVar11[4] = (0 < uStack_210) * (uStack_210 < 0x100) * (char)extraout_XMM0_Qb -
                 (0xff < uStack_210);
    auVar11[5] = (0 < uStack_20e) * (uStack_20e < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x10) -
                 (0xff < uStack_20e);
    auVar11[6] = (0 < uStack_20c) * (uStack_20c < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x20) -
                 (0xff < uStack_20c);
    auVar11[7] = (0 < uStack_20a) * (uStack_20a < 0x100) * (char)((ulong)extraout_XMM0_Qb >> 0x30) -
                 (0xff < uStack_20a);
    auVar10._4_4_ = uVar2;
    auVar10._0_4_ = uVar1;
    auVar11._8_8_ = 0;
    auVar10._8_8_ = 0;
    auVar13 = psadbw(auVar11,auVar10);
    local_208 = auVar13._0_4_;
    local_318 = local_318 + local_208;
    local_2e0 = (undefined4 *)((long)local_2e0 + (long)(iVar12 << 1));
    local_2f0 = (undefined4 *)((long)local_2f0 + (long)(in_ECX << 1));
    local_300 = (undefined4 *)((long)local_300 + (long)(in_R9D << 1));
    in_stack_00000008 = (undefined4 *)((long)in_stack_00000008 + (long)((int)pred[0] << 1));
  }
  return local_318;
}

Assistant:

unsigned int aom_masked_sad4xh_ssse3(const uint8_t *src_ptr, int src_stride,
                                     const uint8_t *a_ptr, int a_stride,
                                     const uint8_t *b_ptr, int b_stride,
                                     const uint8_t *m_ptr, int m_stride,
                                     int height) {
  int y;
  __m128i res = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));

  for (y = 0; y < height; y += 2) {
    // Load two rows at a time, this seems to be a bit faster
    // than four rows at a time in this case.
    const __m128i src =
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(int *)src_ptr),
                           _mm_cvtsi32_si128(*(int *)&src_ptr[src_stride]));
    const __m128i a =
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(int *)a_ptr),
                           _mm_cvtsi32_si128(*(int *)&a_ptr[a_stride]));
    const __m128i b =
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(int *)b_ptr),
                           _mm_cvtsi32_si128(*(int *)&b_ptr[b_stride]));
    const __m128i m =
        _mm_unpacklo_epi32(_mm_cvtsi32_si128(*(int *)m_ptr),
                           _mm_cvtsi32_si128(*(int *)&m_ptr[m_stride]));
    const __m128i m_inv = _mm_sub_epi8(mask_max, m);

    const __m128i data = _mm_unpacklo_epi8(a, b);
    const __m128i mask = _mm_unpacklo_epi8(m, m_inv);
    __m128i pred_16bit = _mm_maddubs_epi16(data, mask);
    pred_16bit = xx_roundn_epu16(pred_16bit, AOM_BLEND_A64_ROUND_BITS);

    const __m128i pred = _mm_packus_epi16(pred_16bit, _mm_setzero_si128());
    res = _mm_add_epi32(res, _mm_sad_epu8(pred, src));

    src_ptr += src_stride * 2;
    a_ptr += a_stride * 2;
    b_ptr += b_stride * 2;
    m_ptr += m_stride * 2;
  }
  // At this point, the SAD is stored in lane 0 of 'res'
  return (unsigned int)_mm_cvtsi128_si32(res);
}